

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_ipp.hpp
# Opt level: O1

shared_ptr<std::mutex,_true> * __thiscall
duckdb::shared_ptr<std::mutex,_true>::operator=
          (shared_ptr<std::mutex,_true> *this,shared_ptr<std::mutex,_true> *other)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  mutex *__tmp;
  
  if (this != other) {
    peVar1 = (other->internal).super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (other->internal).super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (this->internal).super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    this_00 = (this->internal).super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->internal).super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return this;
}

Assistant:

shared_ptr<T> &operator=(const shared_ptr &other) noexcept {
		if (this == &other) {
			return *this;
		}
		// Create a new shared_ptr using the copy constructor, then swap out the ownership to *this
		shared_ptr(other).swap(*this);
		return *this;
	}